

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O2

void __thiscall
proto2_unittest::TestUnpackedExtensions::~TestUnpackedExtensions(TestUnpackedExtensions *this)

{
  ~TestUnpackedExtensions(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

TestUnpackedExtensions::~TestUnpackedExtensions() {
  // @@protoc_insertion_point(destructor:proto2_unittest.TestUnpackedExtensions)
  SharedDtor(*this);
}